

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtils.cpp
# Opt level: O3

string * ApprovalTests::StringUtils::replaceAll
                   (string *__return_storage_ptr__,string *inText,string *find,string *replaceWith)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined8 uVar3;
  ulong uVar4;
  
  for (uVar4 = ::std::__cxx11::string::find((char *)inText,(ulong)(find->_M_dataplus)._M_p,0);
      uVar4 != 0xffffffffffffffff;
      uVar4 = ::std::__cxx11::string::find
                        ((char *)inText,(ulong)(find->_M_dataplus)._M_p,
                         uVar4 + replaceWith->_M_string_length)) {
    ::std::__cxx11::string::replace
              ((ulong)inText,uVar4,(char *)find->_M_string_length,
               (ulong)(replaceWith->_M_dataplus)._M_p);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (inText->_M_dataplus)._M_p;
  paVar1 = &inText->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar1) {
    uVar3 = *(undefined8 *)((long)&inText->field_2 + 8);
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = pcVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  __return_storage_ptr__->_M_string_length = inText->_M_string_length;
  (inText->_M_dataplus)._M_p = (pointer)paVar1;
  inText->_M_string_length = 0;
  (inText->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

APPROVAL_TESTS_NO_DISCARD
    std::string StringUtils::replaceAll(std::string inText,
                                        const std::string& find,
                                        const std::string& replaceWith)
    {
        size_t start_pos = 0;
        while ((start_pos = inText.find(find, start_pos)) != std::string::npos)
        {
            inText.replace(start_pos, find.length(), replaceWith);
            start_pos +=
                replaceWith.length(); // Handles case where 'to' is a substring of 'from'
        }
        return inText;
    }